

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void iutest::detail::
     TypeParameterizedTestSuite<TypedPFoo_DISABLED_,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypedPFoo_DISABLED__::Bar>,_iutest::detail::TypeList1<int>_>
     ::
     EachTest<int,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypedPFoo_DISABLED__::Bar>_>
     ::Register(TestSuite *testsuite,char *test_names)

{
  bool bVar1;
  iu_stringstream *piVar2;
  char *pcVar3;
  ulong uVar4;
  EachTest<int,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypedPFoo_DISABLED__::Bar>_>
  *this;
  iuPool *this_00;
  char *pcVar5;
  string local_238;
  EachTest<int,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypedPFoo_DISABLED__::Bar>_>
  *local_218;
  _Myt *test;
  string local_208 [32];
  undefined1 local_1e8 [8];
  string test_name;
  char *comma;
  char *str;
  IUTestLog local_1a8;
  char *local_18;
  char *test_names_local;
  TestSuite *testsuite_local;
  
  local_18 = test_names;
  test_names_local = (char *)testsuite;
  AlwaysZero();
  bVar1 = IsTrue(local_18 != (char *)0x0);
  if (!bVar1) {
    IUTestLog::IUTestLog
              (&local_1a8,LOG_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
               ,0x1f9);
    piVar2 = IUTestLog::GetStream_abi_cxx11_(&local_1a8);
    std::operator<<((ostream *)&piVar2->field_0x10,"Condition test_names != NULL failed. ");
    IUTestLog::~IUTestLog(&local_1a8);
  }
  pcVar3 = SkipSpace(local_18);
  test_name.field_2._8_8_ = strchr(pcVar3,0x2c);
  std::__cxx11::string::string((string *)local_1e8);
  if (test_name.field_2._8_8_ == 0) {
    std::__cxx11::string::operator=((string *)local_1e8,pcVar3);
  }
  else {
    uVar4 = test_name.field_2._8_8_ - (long)pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,pcVar3,uVar4,(allocator *)((long)&test + 7));
    std::__cxx11::string::operator=((string *)local_1e8,local_208);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)((long)&test + 7));
    test_name.field_2._8_8_ = test_name.field_2._8_8_ + 1;
  }
  this = (EachTest<int,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypedPFoo_DISABLED__::Bar>_>
          *)operator_new(0xd8);
  pcVar3 = test_names_local;
  StripTrailingSpace(&local_238,(string *)local_1e8);
  EachTest(this,(TestSuite *)pcVar3,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  local_218 = this;
  this_00 = iuPool::GetInstance();
  iuPool::push(this_00,&local_218->super_iuIObject);
  pcVar3 = test_names_local;
  pcVar5 = SkipSpace((char *)test_name.field_2._8_8_);
  EachTest<int,_iutest::detail::TemplateTypeList0>::Register((TestSuite *)pcVar3,pcVar5);
  std::__cxx11::string::~string((string *)local_1e8);
  return;
}

Assistant:

static void Register(TestSuite* testsuite, const char* test_names)
        {
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
            IUTEST_CHECK_(test_names != NULL);
            const char* str = detail::SkipSpace(test_names);
            const char* comma = strchr(str, ',');
            ::std::string test_name;
            if( comma == NULL )
            {
                test_name = str;
            }
            else
            {
                test_name = ::std::string(str, static_cast<size_t>(comma - str));
                ++comma;
            }
            _Myt* test = new EachTest(testsuite, StripTrailingSpace(test_name));
            // new オブジェクトを管理してもらう
            detail::iuPool::GetInstance().push(test);

            EachTest<TypeParam, typename TestsList::Tail>::Register(testsuite, detail::SkipSpace(comma));
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
        }